

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall rengine::OpenGLRenderer::activateShader(OpenGLRenderer *this,Program *shader)

{
  Program *pPVar1;
  GLuint GVar2;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  
  pPVar1 = this->m_activeShader;
  if (pPVar1 != shader) {
    GVar2 = 0;
    iVar5 = 0;
    if (pPVar1 != (Program *)0x0) {
      iVar5 = (pPVar1->super_OpenGLShaderProgram).m_attributeCount;
    }
    iVar4 = 0;
    if (shader != (Program *)0x0) {
      GVar2 = (shader->super_OpenGLShaderProgram).m_id;
      iVar4 = (shader->super_OpenGLShaderProgram).m_attributeCount;
    }
    glUseProgram(GVar2);
    for (iVar3 = iVar5; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      glEnableVertexAttribArray(iVar3);
    }
    while (iVar4 < iVar5) {
      iVar5 = iVar5 + -1;
      glDisableVertexAttribArray(iVar5);
    }
    this->m_activeShader = shader;
  }
  return;
}

Assistant:

inline void OpenGLRenderer::activateShader(const Program *shader)
{
    if (shader == m_activeShader)
        return;

    int oldCount = m_activeShader ? m_activeShader->attributeCount() : 0;
    int newCount = 0;

    if (shader) {
        newCount = shader->attributeCount();
        glUseProgram(shader->id());
    } else {
        glUseProgram(0);
    }

    // std::cout << " --- switching shader: old=" << (m_activeShader ? m_activeShader->id() : 0)
    //           << " (" << oldCount << " attr)"
    //           << " new=" << (shader ? shader->id() : 0)
    //           << " (" << newCount << " attr)"
    //           << std::endl;

    // Enable new ones
    for (int i=oldCount; i<newCount; ++i) {
        // std::cout << "    - enable " << i << estd::ndl;
        glEnableVertexAttribArray(i);
    }
    for (int i=oldCount-1; i>=newCount; --i) {
        // std::cout << "    - disable " << i << std::endl;
        glDisableVertexAttribArray(i);
    }

    m_activeShader = shader;
}